

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::NoteOldRevision(cmCTestHG *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  string local_30;
  cmCTestHG *local_10;
  cmCTestHG *this_local;
  
  local_10 = this;
  GetWorkingRevision_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).OldRevision,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"   Old revision of repository is: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_cmCTestGlobalVC).OldRevision);
  std::operator<<(poVar1,"\n");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestHG.cxx"
               ,0x70,msg,false);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).PriorRev,
             (string *)&(this->super_cmCTestGlobalVC).OldRevision);
  return true;
}

Assistant:

bool cmCTestHG::NoteOldRevision()
{
  this->OldRevision = this->GetWorkingRevision();
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Old revision of repository is: " << this->OldRevision
                                                  << "\n");
  this->PriorRev.Rev = this->OldRevision;
  return true;
}